

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O0

int backward(int menu)

{
  menuwindow *pmVar1;
  int iVar2;
  Fl_Menu_Item *this;
  int local_34;
  Fl_Menu_Item *m1;
  int item;
  menuwindow *m;
  menustate *pp;
  int menu_local;
  
  pmVar1 = p->p[menu];
  if (menu == p->menu_number) {
    local_34 = p->item_number;
  }
  else {
    local_34 = pmVar1->selected;
  }
  m1._4_4_ = local_34;
  if (local_34 < 0) {
    m1._4_4_ = pmVar1->numitems;
  }
  do {
    m1._4_4_ = m1._4_4_ + -1;
    if (m1._4_4_ < 0) {
      return 0;
    }
    this = Fl_Menu_Item::next(pmVar1->menu,m1._4_4_);
    iVar2 = Fl_Menu_Item::activevisible(this);
  } while (iVar2 == 0);
  setitem(this,menu,m1._4_4_);
  return 1;
}

Assistant:

static int backward(int menu) { // previous item in menu menu if possible
  menustate &pp = *p;
  menuwindow &m = *(pp.p[menu]);
  int item = (menu == pp.menu_number) ? pp.item_number : m.selected;
  if (item < 0) item = m.numitems;
  while (--item >= 0) {
    const Fl_Menu_Item* m1 = m.menu->next(item);
    if (m1->activevisible()) {setitem(m1, menu, item); return 1;}
  }
  return 0;
}